

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O3

UBool uhash_compareCaselessUnicodeString_63(UElement key1,UElement key2)

{
  short sVar1;
  ushort uVar2;
  byte bVar3;
  UChar *srcChars;
  int iVar4;
  int32_t length;
  UnicodeString *str2;
  UnicodeString *str1;
  int srcStart;
  int srcLength;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  sVar1 = *(short *)((long)key1.pointer + 8);
  uVar2 = *(ushort *)((long)key2.pointer + 8);
  if ((uVar2 & 1) == 0) {
    if ((short)uVar2 < 0) {
      iVar4 = *(int *)((long)key2.pointer + 0xc);
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    srcStart = 0;
    if (iVar4 < 0) {
      srcStart = iVar4;
    }
    srcLength = iVar4 - srcStart;
    if (iVar4 <= iVar4 - srcStart) {
      srcLength = iVar4;
    }
    if (iVar4 < 0) {
      srcLength = 0;
    }
    if (sVar1 < 0) {
      length = *(int32_t *)((long)key1.pointer + 0xc);
    }
    else {
      length = (int)sVar1 >> 5;
    }
    if ((uVar2 & 2) == 0) {
      srcChars = *(UChar **)((long)key2.pointer + 0x18);
    }
    else {
      srcChars = (UChar *)((long)key2.pointer + 10);
    }
    bVar3 = icu_63::UnicodeString::doCaseCompare
                      ((UnicodeString *)key1.pointer,0,length,srcChars,srcStart,srcLength,0);
  }
  else {
    bVar3 = ~(byte)sVar1 & 1;
  }
  return bVar3 == 0;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareCaselessUnicodeString(const UElement key1, const UElement key2) {
    U_NAMESPACE_USE
    const UnicodeString *str1 = (const UnicodeString*) key1.pointer;
    const UnicodeString *str2 = (const UnicodeString*) key2.pointer;
    if (str1 == str2) {
        return TRUE;
    }
    if (str1 == NULL || str2 == NULL) {
        return FALSE;
    }
    return str1->caseCompare(*str2, U_FOLD_CASE_DEFAULT) == 0;
}